

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerializedShaderImpl.cpp
# Opt level: O2

void __thiscall Diligent::SerializedShaderImpl::~SerializedShaderImpl(SerializedShaderImpl *this)

{
  ~SerializedShaderImpl(this);
  free(this);
  return;
}

Assistant:

SerializedShaderImpl::~SerializedShaderImpl()
{
    // Make sure that all asynchrous tasks are complete.
    GetStatus(/*WaitForCompletion = */ true);
}